

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minilua.c
# Opt level: O0

void field(LexState *ls,expdesc *v)

{
  expdesc key;
  FuncState *fs;
  FuncState *in_stack_ffffffffffffffc8;
  FuncState *in_stack_ffffffffffffffd0;
  expdesc *in_stack_ffffffffffffffd8;
  LexState *in_stack_ffffffffffffffe0;
  
  luaK_exp2anyreg(in_stack_ffffffffffffffc8,(expdesc *)0x1189eb);
  luaX_next((LexState *)0x1189f5);
  checkname(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
  luaK_indexed(in_stack_ffffffffffffffd0,(expdesc *)in_stack_ffffffffffffffc8,(expdesc *)0x118a18);
  return;
}

Assistant:

static void field(LexState*ls,expdesc*v){
FuncState*fs=ls->fs;
expdesc key;
luaK_exp2anyreg(fs,v);
luaX_next(ls);
checkname(ls,&key);
luaK_indexed(fs,v,&key);
}